

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O2

vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *
tinyusdz::lerp<tinyusdz::value::vector3h>
          (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *a,
          vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *b,double t)

{
  pointer pvVar1;
  vector3h vVar2;
  ulong __new_size;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  __new_size = ((long)(a->
                      super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(a->
                     super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                     )._M_impl.super__Vector_impl_data._M_start) / 6;
  uVar3 = ((long)(b->
                 super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(b->
                super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                )._M_impl.super__Vector_impl_data._M_start) / 6;
  if (uVar3 < __new_size) {
    __new_size = uVar3;
  }
  if (__new_size != 0) {
    std::vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>::resize
              (__return_storage_ptr__,__new_size);
    if ((long)(a->
              super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
              )._M_impl.super__Vector_impl_data._M_start ==
        (long)(b->
              super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(b->
              super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
              )._M_impl.super__Vector_impl_data._M_start) {
      lVar4 = 0;
      while (bVar5 = __new_size != 0, __new_size = __new_size - 1, bVar5) {
        vVar2 = lerp<tinyusdz::value::vector3h>
                          ((vector3h *)
                           ((long)&(((a->
                                     super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->x).value + lVar4),
                           (vector3h *)
                           ((long)&(((b->
                                     super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->x).value + lVar4),
                           t);
        pvVar1 = (__return_storage_ptr__->
                 super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *(int *)((long)&(pvVar1->x).value + lVar4) = vVar2._0_4_;
        *(uint16_t *)((long)&(pvVar1->z).value + lVar4) = vVar2.z.value.value;
        lVar4 = lVar4 + 6;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}